

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

void embree::UpdateTest::move_mesh(RTCGeometry mesh,size_t numVertices,Vec3fa *pos)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  bool bVar4;
  
  pfVar3 = (float *)rtcGetGeometryBufferData(mesh,1,0);
  while (bVar4 = numVertices != 0, numVertices = numVertices - 1, bVar4) {
    fVar1 = (pos->field_0).m128[1];
    fVar2 = (pos->field_0).m128[2];
    *pfVar3 = (pos->field_0).m128[0] + *pfVar3;
    pfVar3[1] = fVar1 + pfVar3[1];
    pfVar3[2] = fVar2 + pfVar3[2];
    pfVar3[3] = pfVar3[3] + 0.0;
    pfVar3 = pfVar3 + 4;
  }
  rtcUpdateGeometryBuffer(mesh,1,0);
  rtcCommitGeometry(mesh);
  return;
}

Assistant:

static void move_mesh(RTCGeometry mesh, size_t numVertices, Vec3fa& pos) 
    {
      Vec3ff* vertices = (Vec3ff*) rtcGetGeometryBufferData(mesh,RTC_BUFFER_TYPE_VERTEX,0);
      for (size_t i=0; i<numVertices; i++)
        vertices[i] += Vec3ff(pos,0.0f);
      rtcUpdateGeometryBuffer(mesh,RTC_BUFFER_TYPE_VERTEX,0);
      rtcCommitGeometry(mesh);
    }